

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

ALLEGRO_PATH * al_get_standard_path(int id)

{
  _func_ALLEGRO_PATH_ptr_int *UNRECOVERED_JUMPTABLE;
  ALLEGRO_PATH *pAVar1;
  
  if (id == 0) {
    if (active_sysdrv->user_exe_path != (ALLEGRO_PATH *)0x0) {
      pAVar1 = al_clone_path(active_sysdrv->user_exe_path);
      al_set_path_filename(pAVar1,(char *)0x0);
      return pAVar1;
    }
  }
  else if ((id == 6) && (active_sysdrv->user_exe_path != (ALLEGRO_PATH *)0x0)) {
    pAVar1 = al_clone_path(active_sysdrv->user_exe_path);
    return pAVar1;
  }
  UNRECOVERED_JUMPTABLE = active_sysdrv->vt->get_path;
  if (UNRECOVERED_JUMPTABLE == (_func_ALLEGRO_PATH_ptr_int *)0x0) {
    return (ALLEGRO_PATH *)0x0;
  }
  pAVar1 = (*UNRECOVERED_JUMPTABLE)(id);
  return pAVar1;
}

Assistant:

ALLEGRO_PATH *al_get_standard_path(int id)
{
   ASSERT(active_sysdrv);
   ASSERT(active_sysdrv->vt);
   ASSERT(active_sysdrv->vt->get_path);
   
   if (id == ALLEGRO_EXENAME_PATH && active_sysdrv->user_exe_path)
      return al_clone_path(active_sysdrv->user_exe_path);
   
   if (id == ALLEGRO_RESOURCES_PATH && active_sysdrv->user_exe_path) {
      ALLEGRO_PATH *exe_dir = al_clone_path(active_sysdrv->user_exe_path);
      al_set_path_filename(exe_dir, NULL);
      return exe_dir;
   }

   if (active_sysdrv->vt->get_path)
      return active_sysdrv->vt->get_path(id);

   return NULL;
}